

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::ElementsCreateRawTransaction
          (JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::ElementsCreateRawTransactionRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::ElementsCreateRawTransactionRequestStruct_const&)>
  ::
  function<cfd::js::api::RawTransactionResponseStruct(&)(cfd::js::api::ElementsCreateRawTransactionRequestStruct_const&),void>
            ((function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::ElementsCreateRawTransactionRequestStruct_const&)>
              *)&local_38,ElementsTransactionStructApi::CreateRawTransaction);
  ExecuteJsonApi<cfd::js::api::json::ElementsCreateRawTransactionRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::ElementsCreateRawTransactionRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::ElementsCreateRawTransactionRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::ElementsCreateRawTransaction(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::ElementsCreateRawTransactionRequest,
      api::json::RawTransactionResponse,
      api::ElementsCreateRawTransactionRequestStruct,
      api::RawTransactionResponseStruct>(
      request_message, ElementsTransactionStructApi::CreateRawTransaction);
}